

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O0

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstComparisonCondition> *cExpr,int priority)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  bool bVar8;
  shared_ptr<nigel::AstReturning> sVar9;
  shared_ptr<nigel::Token> local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [39];
  byte local_e1;
  undefined1 local_e0 [24];
  undefined1 local_c8 [16];
  undefined1 local_b8 [39];
  byte local_91;
  undefined1 local_90 [16];
  undefined1 local_80 [35];
  byte local_5d;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<nigel::AstExpr> clTerm;
  int priority_local;
  shared_ptr<nigel::AstComparisonCondition> *cExpr_local;
  shared_ptr<nigel::AstExpr> *currLVal_local;
  AST_Parser *this_local;
  
  clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_R8D;
  std::shared_ptr<nigel::AstExpr>::shared_ptr((shared_ptr<nigel::AstExpr> *)local_40,(nullptr_t)0x0)
  ;
  do {
    while( true ) {
      while( true ) {
        peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)cExpr);
        local_5d = 0;
        bVar8 = false;
        if (peVar2->type == combinationCondition) {
          std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)cExpr);
          AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_50);
          local_5d = 1;
          peVar3 = std::
                   __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_50);
          pmVar4 = std::
                   map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                   ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                                 *)(currLVal + 2),&peVar3->op);
          bVar8 = *pmVar4 < clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_;
        }
        if ((local_5d & 1) != 0) {
          std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
                    ((shared_ptr<nigel::AstCombinationCondition> *)local_50);
        }
        if (!bVar8) break;
        std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   cExpr);
        AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)(local_80 + 0x10));
        std::shared_ptr<nigel::AstExpr>::operator=
                  ((shared_ptr<nigel::AstExpr> *)local_40,
                   (shared_ptr<nigel::AstCombinationCondition> *)(local_80 + 0x10));
        std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
                  ((shared_ptr<nigel::AstCombinationCondition> *)(local_80 + 0x10));
        std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   cExpr);
        AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_80);
        peVar3 = std::
                 __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_80);
        std::shared_ptr<nigel::AstExpr>::operator=
                  ((shared_ptr<nigel::AstExpr> *)cExpr,&peVar3->rVal);
        std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
                  ((shared_ptr<nigel::AstCombinationCondition> *)local_80);
      }
      peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)cExpr);
      local_91 = 0;
      bVar8 = false;
      if (peVar2->type == comparisonCondition) {
        std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   cExpr);
        AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_90);
        local_91 = 1;
        peVar5 = std::
                 __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_90);
        pmVar4 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                               *)(currLVal + 2),&peVar5->op);
        bVar8 = *pmVar4 < clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_;
      }
      if ((local_91 & 1) != 0) {
        std::shared_ptr<nigel::AstComparisonCondition>::~shared_ptr
                  ((shared_ptr<nigel::AstComparisonCondition> *)local_90);
      }
      if (!bVar8) break;
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)(local_b8 + 0x10));
      std::shared_ptr<nigel::AstExpr>::operator=
                ((shared_ptr<nigel::AstExpr> *)local_40,
                 (shared_ptr<nigel::AstComparisonCondition> *)(local_b8 + 0x10));
      std::shared_ptr<nigel::AstComparisonCondition>::~shared_ptr
                ((shared_ptr<nigel::AstComparisonCondition> *)(local_b8 + 0x10));
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_b8);
      peVar5 = std::
               __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
      std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar5->rVal);
      std::shared_ptr<nigel::AstComparisonCondition>::~shared_ptr
                ((shared_ptr<nigel::AstComparisonCondition> *)local_b8);
    }
    peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cExpr);
    local_e0[0x17] = 0;
    local_e1 = 0;
    if (peVar2->type == term) {
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_c8);
      local_e0[0x17] = 1;
      peVar6 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),&peVar6->op);
      bVar8 = true;
      if (clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ <= *pmVar4) goto LAB_001e1736;
    }
    else {
LAB_001e1736:
      iVar1 = clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_;
      local_e0._16_4_ = 0x2d;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),(key_type *)(local_e0 + 0x10));
      bVar8 = false;
      if (iVar1 == *pmVar4) {
        std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   cExpr);
        AstExpr::as<nigel::AstTerm>((AstExpr *)local_e0);
        local_e1 = 1;
        peVar6 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_e0);
        pmVar4 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                               *)(currLVal + 2),&peVar6->op);
        bVar8 = *pmVar4 ==
                clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_;
      }
    }
    if ((local_e1 & 1) != 0) {
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_e0);
    }
    if ((local_e0[0x17] & 1) != 0) {
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_c8);
    }
    if (bVar8) {
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)(local_108 + 0x10));
      std::shared_ptr<nigel::AstExpr>::operator=
                ((shared_ptr<nigel::AstExpr> *)local_40,
                 (shared_ptr<nigel::AstTerm> *)(local_108 + 0x10));
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)(local_108 + 0x10))
      ;
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_108);
      peVar6 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_108);
      std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar6->rVal);
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_108);
    }
    else {
      peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)cExpr);
      if (peVar2->type != arithmenticCondition) {
        bVar8 = std::operator!=((shared_ptr<nigel::AstExpr> *)local_40,(nullptr_t)0x0);
        if (bVar8) {
          peVar2 = std::
                   __shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
          if (peVar2->type == combinationCondition) {
            std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_40);
            AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_128);
            peVar3 = std::
                     __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_128);
            std::shared_ptr<nigel::AstCondition>::operator=
                      (&peVar3->rVal,
                       (shared_ptr<nigel::AstComparisonCondition> *)
                       CONCAT44(in_register_0000000c,priority));
            std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
                      ((shared_ptr<nigel::AstCombinationCondition> *)local_128);
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
            std::shared_ptr<nigel::Token>::shared_ptr(&local_138,&peVar2->token);
            BuilderExecutable::generateNotification
                      ((BuilderExecutable *)currLVal,err_comparisonConditionCannotBeThisRValue,
                       &local_138);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_138);
          }
          std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)cExpr);
          AstExpr::as<nigel::AstReturning>((AstExpr *)this);
        }
        else {
          std::shared_ptr<nigel::AstExpr>::operator=
                    (currLVal + 0xb,
                     (shared_ptr<nigel::AstComparisonCondition> *)
                     CONCAT44(in_register_0000000c,priority));
          std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)cExpr);
          AstExpr::as<nigel::AstReturning>((AstExpr *)this);
        }
        std::shared_ptr<nigel::AstExpr>::~shared_ptr((shared_ptr<nigel::AstExpr> *)local_40);
        sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = extraout_RDX._M_pi;
        sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<nigel::AstReturning>)
               sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
      }
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)local_118);
      peVar7 = std::
               __shared_ptr_access<nigel::AstArithmeticCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::AstArithmeticCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_118);
      std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar7->ret);
      std::shared_ptr<nigel::AstArithmeticCondition>::~shared_ptr
                ((shared_ptr<nigel::AstArithmeticCondition> *)local_118);
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstComparisonCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;
		while( true )
		{//Split all possible (unatomic) expressions
			if( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstCombinationCondition>();
				currLVal = currLVal->as<AstCombinationCondition>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::comparisonCondition && opPriority[currLVal->as<AstComparisonCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstComparisonCondition>();
				currLVal = currLVal->as<AstComparisonCondition>()->rVal;
			}
			else if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal->as<AstTerm>();
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::arithmenticCondition )
			{
				currLVal = currLVal->as<AstArithmeticCondition>()->ret;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::combinationCondition ) clTerm->as<AstCombinationCondition>()->rVal = cExpr;
			else generateNotification( NT::err_comparisonConditionCannotBeThisRValue, clTerm->token );
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}